

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall libcellml::Logger::LoggerImpl::removeError(LoggerImpl *this,size_t index)

{
  pointer psVar1;
  reference pvVar2;
  
  psVar1 = (this->mIssues).
           super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&this->mErrors,index);
  std::
  vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>::
  erase(&this->mIssues,psVar1 + *pvVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (&this->mErrors,
             (const_iterator)
             ((this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start + index));
  return;
}

Assistant:

void Logger::LoggerImpl::removeError(size_t index)
{
    mIssues.erase(mIssues.begin() + ptrdiff_t(mErrors.at(index)));
    mErrors.erase(mErrors.begin() + ptrdiff_t(index));
}